

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tiles.cpp
# Opt level: O2

void __thiscall Tiles::Tiles(Tiles *this)

{
  TileType TVar1;
  int iVar2;
  
  iVar2 = rand();
  TVar1 = EMPTY;
  if ((uint)(iVar2 % 5) < EMPTY) {
    TVar1 = iVar2 % 5;
  }
  this->data = TVar1;
  return;
}

Assistant:

Tiles::Tiles()
{
	//Quick Test
	int switchCase = rand() % 5;

	switch(switchCase)
	{
		case 0:
			data = WATER;
			break;
		case 1:
			data = GRASS;
			break;
		case 2:
			data = PATH;
			break;
		case 3:
			data = MOUNTAIN;
			break;
		case 4:
			data = FOREST;
			break;
		default: data = EMPTY;
	}
	//data = WATER;
}